

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

void lj_tab_resize(lua_State *L,GCtab *t,uint32_t asize,uint32_t hbits)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  long lVar7;
  TValue *pTVar8;
  anon_struct_8_2_fd66bcdd_for_TValue_2 *paVar9;
  ulong uVar10;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  lua_State *in_RDI;
  Node *n_1;
  uint32_t i_3;
  global_State *g_1;
  uint32_t i_2;
  TValue *array_1;
  global_State *g;
  TValue *oarray;
  uint32_t i;
  TValue *array;
  uint32_t oldhmask;
  uint32_t oldasize;
  Node *oldnode;
  Node *n;
  Node *node_1;
  uint32_t hmask;
  uint32_t i_1;
  Node *node;
  uint32_t hsize;
  undefined8 in_stack_fffffffffffffe98;
  ErrMsg em;
  lua_State *in_stack_fffffffffffffea0;
  GCSize osz;
  void *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  uint uVar11;
  cTValue *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  lua_State *in_stack_fffffffffffffec8;
  uint local_11c;
  void *local_118;
  uint local_d4;
  
  uVar1 = *(uint *)(in_RSI + 0x14);
  uVar11 = *(uint *)(in_RSI + 0x18);
  uVar2 = *(uint *)(in_RSI + 0x1c);
  em = (ErrMsg)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  if (uVar11 < in_EDX) {
    if (0x8000001 < in_EDX) {
      lj_err_msg(in_stack_fffffffffffffea0,em);
    }
    osz = (GCSize)((ulong)in_stack_fffffffffffffea0 >> 0x20);
    if (*(char *)(in_RSI + 7) < '\x01') {
      local_118 = lj_mem_realloc((lua_State *)
                                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                 in_stack_fffffffffffffea8,osz,(GCSize)in_stack_fffffffffffffea0);
    }
    else {
      uVar3 = *(uint *)(in_RSI + 8);
      local_118 = lj_mem_realloc((lua_State *)
                                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                 in_stack_fffffffffffffea8,osz,(GCSize)in_stack_fffffffffffffea0);
      *(byte *)(in_RSI + 7) = *(byte *)(in_RSI + 7) | 0x80;
      for (local_11c = 0; local_11c < uVar11; local_11c = local_11c + 1) {
        *(undefined8 *)((long)local_118 + (ulong)local_11c * 8) =
             *(undefined8 *)((ulong)uVar3 + (ulong)local_11c * 8);
      }
    }
    *(int *)(in_RSI + 8) = (int)local_118;
    *(uint *)(in_RSI + 0x18) = in_EDX;
    for (local_11c = uVar11; local_11c < in_EDX; local_11c = local_11c + 1) {
      *(undefined4 *)((long)local_118 + (ulong)local_11c * 8 + 4) = 0xffffffff;
    }
  }
  if (in_ECX == 0) {
    *(uint32_t *)(in_RSI + 0x14) = (in_RDI->glref).ptr32 + 0x130;
    *(undefined4 *)(in_RSI + 0x1c) = 0;
  }
  else {
    if (0x1a < in_ECX) {
      lj_err_msg(in_stack_fffffffffffffea0,em);
    }
    iVar5 = 1 << ((byte)in_ECX & 0x1f);
    pvVar6 = lj_mem_realloc((lua_State *)
                            CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                            in_stack_fffffffffffffea8,
                            (GCSize)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                            (GCSize)in_stack_fffffffffffffea0);
    *(int *)(in_RSI + 0x14) = (int)pvVar6;
    *(int *)((long)pvVar6 + 0x14) = (int)pvVar6 + iVar5 * 0x18;
    *(int *)(in_RSI + 0x1c) = iVar5 + -1;
    uVar3 = *(uint *)(in_RSI + 0x1c);
    uVar4 = *(uint *)(in_RSI + 0x14);
    for (local_d4 = 0; local_d4 <= uVar3; local_d4 = local_d4 + 1) {
      lVar7 = (ulong)uVar4 + (ulong)local_d4 * 0x18;
      *(undefined4 *)(lVar7 + 0x10) = 0;
      *(undefined4 *)(lVar7 + 0xc) = 0xffffffff;
      *(undefined4 *)(lVar7 + 4) = 0xffffffff;
    }
  }
  if (in_EDX < uVar11) {
    in_stack_fffffffffffffec8 = (lua_State *)(ulong)*(uint *)(in_RSI + 8);
    *(uint *)(in_RSI + 0x18) = in_EDX;
    for (in_stack_fffffffffffffec4 = in_EDX; in_stack_fffffffffffffec4 < uVar11;
        in_stack_fffffffffffffec4 = in_stack_fffffffffffffec4 + 1) {
      if (*(int *)(&in_stack_fffffffffffffec8->marked + (ulong)in_stack_fffffffffffffec4 * 8) != -1)
      {
        in_stack_fffffffffffffea0 = in_RDI;
        pTVar8 = lj_tab_setinth((lua_State *)&in_stack_fffffffffffffeb8->field_2,
                                (GCtab *)CONCAT44(in_stack_fffffffffffffeb4,
                                                  in_stack_fffffffffffffeb0),
                                (int32_t)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        *pTVar8 = *(TValue *)
                   (&in_stack_fffffffffffffec8->nextgc + (ulong)in_stack_fffffffffffffec4 * 2);
      }
    }
    if (*(char *)(in_RSI + 7) < '\x01') {
      pvVar6 = lj_mem_realloc((lua_State *)
                              CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                              in_stack_fffffffffffffea8,
                              (GCSize)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                              (GCSize)in_stack_fffffffffffffea0);
      *(int *)(in_RSI + 8) = (int)pvVar6;
    }
  }
  if (uVar2 != 0) {
    for (uVar11 = 0; uVar11 <= uVar2; uVar11 = uVar11 + 1) {
      paVar9 = (anon_struct_8_2_fd66bcdd_for_TValue_2 *)((ulong)uVar1 + (ulong)uVar11 * 0x18);
      if (paVar9->it != 0xffffffff) {
        pTVar8 = lj_tab_set(in_stack_fffffffffffffec8,
                            (GCtab *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffeb8);
        pTVar8->field_2 = *paVar9;
      }
    }
    uVar10 = (ulong)(in_RDI->glref).ptr32;
    lVar7 = (ulong)(uVar2 + 1) * 0x18;
    *(int *)(uVar10 + 0x50) = *(int *)(uVar10 + 0x50) - (int)lVar7;
    *(long *)(uVar10 + 0x90) = lVar7 + *(long *)(uVar10 + 0x90);
    (**(code **)(uVar10 + 0x40))(*(undefined8 *)(uVar10 + 0x48),(ulong)uVar1,lVar7,0);
  }
  return;
}

Assistant:

void lj_tab_resize(lua_State *L, GCtab *t, uint32_t asize, uint32_t hbits)
{
  Node *oldnode = noderef(t->node);
  uint32_t oldasize = t->asize;
  uint32_t oldhmask = t->hmask;
  if (asize > oldasize) {  /* Array part grows? */
    TValue *array;
    uint32_t i;
    if (asize > LJ_MAX_ASIZE)
      lj_err_msg(L, LJ_ERR_TABOV);
    if (LJ_MAX_COLOSIZE != 0 && t->colo > 0) {
      /* A colocated array must be separated and copied. */
      TValue *oarray = tvref(t->array);
      array = lj_mem_newvec(L, asize, TValue);
      t->colo = (int8_t)(t->colo | 0x80);  /* Mark as separated (colo < 0). */
      for (i = 0; i < oldasize; i++)
	copyTV(L, &array[i], &oarray[i]);
    } else {
      array = (TValue *)lj_mem_realloc(L, tvref(t->array),
			  oldasize*sizeof(TValue), asize*sizeof(TValue));
    }
    setmref(t->array, array);
    t->asize = asize;
    for (i = oldasize; i < asize; i++)  /* Clear newly allocated slots. */
      setnilV(&array[i]);
  }
  /* Create new (empty) hash part. */
  if (hbits) {
    newhpart(L, t, hbits);
    clearhpart(t);
  } else {
    global_State *g = G(L);
    setmref(t->node, &g->nilnode);
#if LJ_GC64
    setmref(t->freetop, &g->nilnode);
#endif
    t->hmask = 0;
  }
  if (asize < oldasize) {  /* Array part shrinks? */
    TValue *array = tvref(t->array);
    uint32_t i;
    t->asize = asize;  /* Note: This 'shrinks' even colocated arrays. */
    for (i = asize; i < oldasize; i++)  /* Reinsert old array values. */
      if (!tvisnil(&array[i]))
	copyTV(L, lj_tab_setinth(L, t, (int32_t)i), &array[i]);
    /* Physically shrink only separated arrays. */
    if (LJ_MAX_COLOSIZE != 0 && t->colo <= 0)
      setmref(t->array, lj_mem_realloc(L, array,
	      oldasize*sizeof(TValue), asize*sizeof(TValue)));
  }
  if (oldhmask > 0) {  /* Reinsert pairs from old hash part. */
    global_State *g;
    uint32_t i;
    for (i = 0; i <= oldhmask; i++) {
      Node *n = &oldnode[i];
      if (!tvisnil(&n->val))
	copyTV(L, lj_tab_set(L, t, &n->key), &n->val);
    }
    g = G(L);
    lj_mem_freevec(g, oldnode, oldhmask+1, Node);
  }
}